

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint32_t farmhash32_sa(char *s,size_t len)

{
  undefined1 auVar1 [16];
  __m128i e_00;
  __m128i e_01;
  __m128i d_00;
  __m128i d_01;
  __m128i d_02;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  undefined4 uVar20;
  int iVar21;
  undefined4 uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined4 uVar26;
  ulong uVar27;
  ulong in_RSI;
  char *in_RDI;
  longlong lVar29;
  longlong lVar30;
  longlong lVar31;
  longlong lVar32;
  __m128i alVar33;
  __m128i x_00;
  __m128i x_01;
  __m128i x_02;
  __m128i x_03;
  __m128i x_04;
  __m128i x_05;
  __m128i x_06;
  __m128i x_07;
  __m128i x_08;
  __m128i x_09;
  __m128i x_10;
  __m128i x_11;
  __m128i x_12;
  __m128i x_13;
  __m128i x_14;
  __m128i x_15;
  __m128i x_16;
  __m128i x_17;
  __m128i x_18;
  __m128i x_19;
  __m128i x_20;
  __m128i x_21;
  __m128i x_22;
  __m128i x_23;
  __m128i x_24;
  __m128i x_25;
  __m128i x_26;
  __m128i x_27;
  __m128i x_28;
  __m128i x_29;
  __m128i x_30;
  __m128i x_31;
  __m128i x_32;
  __m128i x_33;
  __m128i x_34;
  __m128i x_35;
  __m128i x_36;
  __m128i x_37;
  __m128i x_38;
  __m128i x_39;
  __m128i x_40;
  __m128i x_41;
  __m128i x_42;
  __m128i x_43;
  __m128i x_44;
  __m128i x_45;
  __m128i x_46;
  __m128i x_47;
  __m128i x_48;
  __m128i x_49;
  __m128i x_50;
  __m128i x_51;
  __m128i x_52;
  __m128i x_53;
  __m128i x_54;
  __m128i x_55;
  __m128i x_56;
  __m128i x_57;
  __m128i x_58;
  __m128i x_59;
  __m128i x_60;
  __m128i x_61;
  __m128i x_62;
  __m128i x_63;
  __m128i x_64;
  __m128i x_65;
  __m128i x_66;
  __m128i x_67;
  __m128i x_68;
  __m128i x_69;
  __m128i x_70;
  __m128i y_00;
  __m128i y_01;
  __m128i y_02;
  __m128i y_03;
  __m128i y_04;
  __m128i y_05;
  __m128i y_06;
  __m128i y_07;
  __m128i y_08;
  __m128i y_09;
  __m128i y_10;
  __m128i y_11;
  __m128i y_12;
  __m128i y_13;
  __m128i y_14;
  __m128i y_15;
  __m128i y_16;
  __m128i y_17;
  __m128i y_18;
  __m128i y_19;
  __m128i y_20;
  __m128i y_21;
  __m128i y_22;
  __m128i y_23;
  __m128i y_24;
  __m128i y_25;
  __m128i y_26;
  __m128i y_27;
  __m128i y_28;
  __m128i y_29;
  __m128i y_30;
  __m128i y_31;
  __m128i y_32;
  __m128i y_33;
  __m128i y_34;
  __m128i y_35;
  __m128i y_36;
  __m128i y_37;
  __m128i y_38;
  __m128i y_39;
  __m128i y_40;
  __m128i y_41;
  __m128i y_42;
  __m128i y_43;
  __m128i y_44;
  __m128i y_45;
  __m128i y_46;
  __m128i y_47;
  __m128i y_48;
  __m128i y_49;
  __m128i y_50;
  __m128i y_51;
  __m128i y_52;
  __m128i y_53;
  __m128i y_54;
  __m128i y_55;
  __m128i y_56;
  __m128i y_57;
  __m128i y_58;
  __m128i y_59;
  __m128i y_60;
  __m128i y_61;
  __m128i y_62;
  __m128i y_63;
  __m128i y_64;
  __m128i y_65;
  __m128i y_66;
  uint32_t o;
  uint32_t z;
  uint32_t y;
  uint32_t x;
  __m128i buf [4];
  __m128i be_2;
  __m128i e_2;
  __m128i d_3;
  __m128i c_3;
  __m128i b_3;
  __m128i a_3;
  __m128i be_1;
  __m128i e_1;
  __m128i d_2;
  __m128i c_2;
  __m128i b_2;
  __m128i a_2;
  size_t iters;
  __m128i be;
  __m128i e;
  __m128i d_1;
  __m128i c_1;
  __m128i b_1;
  __m128i a_1;
  __m128i k;
  __m128i f;
  __m128i g;
  __m128i h;
  __m128i cc2;
  __m128i cc1;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t seed;
  undefined4 in_stack_fffffffffffffb00;
  uint32_t in_stack_fffffffffffffb04;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  longlong in_stack_fffffffffffffb28;
  longlong in_stack_fffffffffffffb30;
  longlong in_stack_fffffffffffffb38;
  longlong in_stack_fffffffffffffb40;
  longlong in_stack_fffffffffffffb48;
  uint32_t local_490;
  uint32_t local_48c;
  longlong local_478;
  longlong lStack_470;
  longlong local_468;
  longlong lStack_460;
  longlong local_458;
  longlong lStack_450;
  longlong local_448;
  longlong lStack_440;
  longlong local_438;
  longlong lStack_430;
  longlong local_428;
  longlong lStack_420;
  longlong local_418;
  longlong lStack_410;
  longlong local_408;
  longlong lStack_400;
  longlong local_3f8;
  longlong lStack_3f0;
  longlong local_3e8;
  longlong lStack_3e0;
  longlong local_3d8;
  longlong lStack_3d0;
  longlong local_3c8;
  longlong lStack_3c0;
  longlong local_3b8;
  longlong lStack_3b0;
  longlong local_3a8;
  longlong lStack_3a0;
  longlong local_398;
  longlong lStack_390;
  longlong local_388;
  longlong lStack_380;
  ulong local_370;
  longlong local_368;
  longlong lStack_360;
  longlong local_358;
  longlong lStack_350;
  longlong local_348;
  longlong lStack_340;
  longlong local_338;
  longlong lStack_330;
  longlong local_328;
  longlong lStack_320;
  longlong local_318;
  longlong lStack_310;
  longlong local_308;
  longlong lStack_300;
  longlong local_2f8;
  longlong lStack_2f0;
  longlong local_2e8;
  longlong lStack_2e0;
  longlong local_2d8;
  longlong lStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  uint32_t local_29c;
  int local_298;
  int local_294;
  uint32_t local_290;
  undefined4 local_28c;
  ulong local_288;
  longlong *local_280;
  uint32_t local_278;
  uint32_t local_26c;
  undefined4 local_268;
  uint32_t local_264;
  int local_260;
  uint32_t local_25c;
  undefined4 local_258;
  uint32_t local_254;
  int local_250;
  uint32_t local_24c;
  int local_248;
  uint32_t local_244;
  int local_240;
  uint32_t local_23c;
  undefined4 local_238;
  uint32_t local_234;
  int local_230;
  uint32_t local_22c;
  undefined4 local_228;
  uint32_t local_224;
  int local_220;
  uint32_t local_21c;
  uint32_t local_218;
  uint32_t local_214;
  uint32_t local_210;
  int local_20c;
  int local_208;
  uint local_204;
  uint local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  longlong local_1e8;
  longlong lStack_1e0;
  longlong local_1d8;
  longlong lStack_1d0;
  longlong local_1c8;
  longlong lStack_1c0;
  longlong local_1b8;
  longlong lStack_1b0;
  longlong local_1a8;
  longlong lStack_1a0;
  longlong local_198;
  longlong lStack_190;
  longlong local_188;
  longlong lStack_180;
  longlong local_178;
  longlong lStack_170;
  longlong local_168;
  longlong lStack_160;
  longlong local_158;
  longlong lStack_150;
  longlong local_148;
  longlong lStack_140;
  longlong local_138;
  longlong lStack_130;
  longlong local_128;
  longlong lStack_120;
  longlong local_118;
  longlong lStack_110;
  longlong local_108;
  longlong lStack_100;
  longlong local_f8;
  longlong lStack_f0;
  undefined1 local_e8 [16];
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined1 local_88 [16];
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined1 local_68 [16];
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined1 local_48 [16];
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  undefined1 local_28 [16];
  uint local_10;
  uint local_c;
  uint local_8;
  uint local_4;
  ulong uVar28;
  
  local_28c = 0x51;
  if (in_RSI < 0x19) {
    if (in_RSI < 0xd) {
      if (in_RSI < 5) {
        local_48c = farmhash32_mk_len_0_to_4
                              ((char *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10)
                               ,CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                               in_stack_fffffffffffffb04);
      }
      else {
        local_48c = farmhash32_mk_len_5_to_12
                              ((char *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10)
                               ,CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                               in_stack_fffffffffffffb04);
      }
      local_490 = local_48c;
    }
    else {
      local_490 = farmhash32_mk_len_13_to_24
                            ((char *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                             CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                             in_stack_fffffffffffffb04);
    }
    local_278 = local_490;
  }
  else {
    local_288 = in_RSI;
    local_280 = (longlong *)in_RDI;
    if (in_RSI < 0x28) {
      local_290 = (uint32_t)in_RSI;
      local_294 = -0x4a380c7d;
      local_298 = local_290 + -0x4a380c7d;
      uVar17 = fetch32(in_RDI + (in_RSI - 4));
      local_290 = uVar17 + local_290;
      uVar17 = fetch32((char *)((long)local_280 + (local_288 - 0x14)));
      local_294 = uVar17 + local_294;
      uVar17 = fetch32((char *)((long)local_280 + (local_288 - 0x10)));
      local_298 = uVar17 + local_298;
      local_29c = local_290;
      local_290 = ror32(local_290,0x15);
      mur(0,0x2148ce);
      mur(0,0x2148dc);
      local_290 = mur(0,0x2148ea);
      uVar17 = fetch32((char *)((long)local_280 + (local_288 - 0xc)));
      local_290 = uVar17 + local_290;
      uVar17 = fetch32((char *)((long)local_280 + (local_288 - 8)));
      local_294 = uVar17 + local_294;
      local_29c = local_290 + local_29c;
      local_290 = local_29c + local_290;
      uVar17 = mur(0,0x21497c);
      local_294 = uVar17 * 0x1b873593;
      local_20c = local_294 + local_298;
      local_208 = local_290;
      local_290 = crc32(local_290,local_20c);
      local_278 = farmhash32_mk_len_13_to_24
                            ((char *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                             CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                             in_stack_fffffffffffffb04);
      local_278 = local_278 + local_294;
    }
    else {
      local_1ec = 0xcc9e2d51;
      local_cc = 0xcc9e2d51;
      local_d0 = 0xcc9e2d51;
      local_d4 = 0xcc9e2d51;
      local_d8 = 0xcc9e2d51;
      auVar1 = vpinsrd_avx(ZEXT416(0xcc9e2d51),0xcc9e2d51,1);
      auVar1 = vpinsrd_avx(auVar1,0xcc9e2d51,2);
      local_e8 = vpinsrd_avx(auVar1,0xcc9e2d51,3);
      local_2b8 = local_e8._0_8_;
      uStack_2b0 = local_e8._8_8_;
      local_1f0 = 0x1b873593;
      local_ac = 0x1b873593;
      local_b0 = 0x1b873593;
      local_b4 = 0x1b873593;
      local_b8 = 0x1b873593;
      auVar1 = vpinsrd_avx(ZEXT416(0x1b873593),0x1b873593,1);
      auVar1 = vpinsrd_avx(auVar1,0x1b873593,2);
      local_c8 = vpinsrd_avx(auVar1,0x1b873593,3);
      local_2c8 = local_c8._0_8_;
      uStack_2c0 = local_c8._8_8_;
      local_1f4 = 0x51;
      local_8c = 0x51;
      local_90 = 0x51;
      local_94 = 0x51;
      local_98 = 0x51;
      auVar1 = vpinsrd_avx(ZEXT416(0x51),0x51,1);
      auVar1 = vpinsrd_avx(auVar1,0x51,2);
      local_a8 = vpinsrd_avx(auVar1,0x51,3);
      local_2d8 = local_a8._0_8_;
      lStack_2d0 = local_a8._8_8_;
      local_1f8 = 0xbe0c56a1;
      local_6c = 0xbe0c56a1;
      local_70 = 0xbe0c56a1;
      local_74 = 0xbe0c56a1;
      local_78 = 0xbe0c56a1;
      auVar1 = vpinsrd_avx(ZEXT416(0xbe0c56a1),0xbe0c56a1,1);
      auVar1 = vpinsrd_avx(auVar1,0xbe0c56a1,2);
      local_88 = vpinsrd_avx(auVar1,0xbe0c56a1,3);
      local_2e8 = local_88._0_8_;
      lStack_2e0 = local_88._8_8_;
      local_2f8 = local_88._0_8_;
      lStack_2f0 = local_88._8_8_;
      local_1fc = 0xe6546b64;
      local_4c = 0xe6546b64;
      local_50 = 0xe6546b64;
      local_54 = 0xe6546b64;
      local_58 = 0xe6546b64;
      auVar1 = vpinsrd_avx(ZEXT416(0xe6546b64),0xe6546b64,1);
      auVar1 = vpinsrd_avx(auVar1,0xe6546b64,2);
      local_68 = vpinsrd_avx(auVar1,0xe6546b64,3);
      local_308 = local_68._0_8_;
      lStack_300 = local_68._8_8_;
      if (in_RSI < 0x50) {
        lVar31 = local_68._0_8_;
        lVar29 = local_68._8_8_;
        fetch128(in_RDI);
        local_318 = lVar31;
        lStack_310 = lVar29;
        fetch128((char *)((long)local_280 + 0x10));
        local_328 = lVar31;
        lStack_320 = lVar29;
        fetch128((char *)((long)local_280 + (local_288 - 0xf >> 1)));
        local_338 = lVar31;
        lStack_330 = lVar29;
        fetch128((char *)((long)local_280 + (local_288 - 0x20)));
        in_RDI = (char *)((long)local_280 + (local_288 - 0x10));
        uVar27 = local_288;
        local_348 = lVar31;
        lStack_340 = lVar29;
        alVar33 = fetch128(in_RDI);
        y_00[0] = alVar33[1];
        x_00[1] = in_RSI;
        x_00[0] = (longlong)in_RDI;
        y_00[1] = uVar27;
        local_358 = lVar31;
        lStack_350 = lVar29;
        alVar33 = add32x4(x_00,y_00);
        y_01[0] = alVar33[1];
        x_01[1] = in_RSI;
        x_01[0] = (longlong)in_RDI;
        y_01[1] = uVar27;
        add32x4(x_01,y_01);
        x_02[1] = in_RSI;
        x_02[0] = (longlong)in_RDI;
        alVar33 = shuf32x4_0_3_2_1(x_02);
        y_02[0] = alVar33[1];
        x_03[1] = in_RSI;
        x_03[0] = (longlong)in_RDI;
        y_02[1] = uVar27;
        alVar33 = add32x4(x_03,y_02);
        lVar31 = lStack_320;
        y_03[0] = alVar33[1];
        x_04[1] = in_RSI;
        x_04[0] = (longlong)in_RDI;
        y_03[1] = uVar27;
        lVar29 = local_328;
        alVar33 = mul32x4(x_04,y_03);
        y_04[0] = alVar33[1];
        x_05[1] = in_RSI;
        x_05[0] = (longlong)in_RDI;
        y_04[1] = uVar27;
        lVar30 = lVar29;
        alVar33 = add32x4(x_05,y_04);
        y_05[0] = alVar33[1];
        x_06[1] = in_RSI;
        x_06[0] = (longlong)in_RDI;
        y_05[1] = uVar27;
        local_368 = lVar29;
        lStack_360 = lVar31;
        alVar33 = add32x4(x_06,y_05);
        y_06[0] = alVar33[1];
        x_07[1] = in_RSI;
        x_07[0] = (longlong)in_RDI;
        y_06[1] = uVar27;
        add32x4(x_07,y_06);
        a_00[1] = lVar30;
        a_00[0] = in_stack_fffffffffffffb40;
        b_00[1] = in_stack_fffffffffffffb38;
        b_00[0] = in_stack_fffffffffffffb30;
        c_00[0]._4_4_ = in_stack_fffffffffffffb24;
        c_00[0]._0_4_ = in_stack_fffffffffffffb20;
        c_00[1] = in_stack_fffffffffffffb28;
        d_00[0]._4_4_ = in_stack_fffffffffffffb14;
        d_00[0]._0_4_ = in_stack_fffffffffffffb10;
        d_00[1]._0_4_ = in_stack_fffffffffffffb18;
        d_00[1]._4_4_ = in_stack_fffffffffffffb1c;
        e_00[0]._4_4_ = in_stack_fffffffffffffb04;
        e_00[0]._0_4_ = in_stack_fffffffffffffb00;
        e_00[1]._0_4_ = in_stack_fffffffffffffb08;
        e_00[1]._4_4_ = in_stack_fffffffffffffb0c;
        lVar31 = local_348;
        lVar29 = lStack_340;
        alVar33 = murk(a_00,b_00,c_00,d_00,e_00);
        y_07[0] = alVar33[1];
        x_08[1] = in_RSI;
        x_08[0] = (longlong)in_RDI;
        y_07[1] = uVar27;
        alVar33 = add32x4(x_08,y_07);
        y_08[0] = alVar33[1];
        local_f8 = local_2e8;
        lStack_f0 = lStack_2e0;
        local_108 = local_2f8;
        lStack_100 = lStack_2f0;
        auVar16._8_8_ = lStack_2e0;
        auVar16._0_8_ = local_2e8;
        auVar15._8_8_ = lStack_2f0;
        auVar15._0_8_ = local_2f8;
        vpshufb_avx(auVar16,auVar15);
        x_09[1] = in_RSI;
        x_09[0] = (longlong)in_RDI;
        y_08[1] = uVar27;
        local_2d8 = lVar31;
        lStack_2d0 = lVar29;
        alVar33 = xor128(x_09,y_08);
        y_09[0] = alVar33[1];
        x_10[1] = in_RSI;
        x_10[0] = (longlong)in_RDI;
        y_09[1] = uVar27;
        lVar31 = local_338;
        lVar29 = lStack_330;
        alVar33 = xor128(x_10,y_09);
        y_10[0] = alVar33[1];
        x_11[1] = in_RSI;
        x_11[0] = (longlong)in_RDI;
        y_10[1] = uVar27;
        alVar33 = add32x4(x_11,y_10);
        y_11[0] = alVar33[1];
        x_12[1] = in_RSI;
        x_12[0] = (longlong)in_RDI;
        y_11[1] = uVar27;
        lVar30 = local_368;
        lVar32 = lStack_360;
        local_2e8 = lVar31;
        lStack_2e0 = lVar29;
        alVar33 = xor128(x_12,y_11);
        y_12[0] = alVar33[1];
        x_13[1] = in_RSI;
        x_13[0] = (longlong)in_RDI;
        y_12[1] = uVar27;
        alVar33 = add32x4(x_13,y_12);
        y_13[0] = alVar33[1];
        x_14[1] = in_RSI;
        x_14[0] = (longlong)in_RDI;
        y_13[1] = uVar27;
        local_2f8 = lVar30;
        lStack_2f0 = lVar32;
        alVar33 = add32x4(x_14,y_13);
        y_14[0] = alVar33[1];
        local_118 = local_2f8;
        lStack_110 = lStack_2f0;
        local_128 = local_2d8;
        lStack_120 = lStack_2d0;
        auVar14._8_8_ = lStack_2f0;
        auVar14._0_8_ = local_2f8;
        auVar13._8_8_ = lStack_2d0;
        auVar13._0_8_ = local_2d8;
        vpshufb_avx(auVar14,auVar13);
        x_15[1] = in_RSI;
        x_15[0] = (longlong)in_RDI;
        y_14[1] = uVar27;
        alVar33 = add32x4(x_15,y_14);
        y_15[0] = alVar33[1];
        x_16[1] = in_RSI;
        x_16[0] = (longlong)in_RDI;
        y_15[1] = uVar27;
        alVar33 = add32x4(x_16,y_15);
        y_16[0] = alVar33[1];
        x_17[1] = in_RSI;
        x_17[0] = (longlong)in_RDI;
        y_16[1] = uVar27;
        add32x4(x_17,y_16);
        local_200 = (uint)local_288;
        local_2c = (uint)local_288;
        local_30 = (uint)local_288;
        local_34 = (uint)local_288;
        local_38 = (uint)local_288;
        y_17[0] = local_288 & 0xffffffff;
        auVar1 = vpinsrd_avx(ZEXT416((uint)local_288),(uint)local_288,1);
        auVar1 = vpinsrd_avx(auVar1,(uint)local_288,2);
        local_48 = vpinsrd_avx(auVar1,(uint)local_288,3);
        lVar31 = local_48._0_8_;
        lVar29 = local_48._8_8_;
        x_18[1] = in_RSI;
        x_18[0] = (longlong)in_RDI;
        y_17[1]._0_4_ = (uint)local_288;
        y_17[1]._4_4_ = 0;
        uVar28 = local_288 & 0xffffffff;
        alVar33 = mul32x4(x_18,y_17);
        y_18[0] = alVar33[1];
        x_19[1] = in_RSI;
        x_19[0] = (longlong)in_RDI;
        y_18[1] = uVar28;
        add32x4(x_19,y_18);
        local_2e8 = lVar31;
        lStack_2e0 = lVar29;
      }
      else {
        local_370 = (in_RSI - 1) / 0x50;
        local_288 = in_RSI + local_370 * -0x50;
        lVar31 = local_68._0_8_;
        lVar29 = local_68._8_8_;
        while (uVar27 = local_370 - 1, local_370 != 0) {
          local_370 = uVar27;
          fetch128((char *)local_280);
          local_388 = lVar31;
          lStack_380 = lVar29;
          fetch128((char *)((long)local_280 + 0x10));
          local_398 = lVar31;
          lStack_390 = lVar29;
          fetch128((char *)((long)local_280 + 0x20));
          local_3a8 = lVar31;
          lStack_3a0 = lVar29;
          fetch128((char *)((long)local_280 + 0x30));
          in_RDI = (char *)((long)local_280 + 0x40);
          local_3b8 = lVar31;
          lStack_3b0 = lVar29;
          alVar33 = fetch128(in_RDI);
          y_19[0] = alVar33[1];
          x_20[1] = in_RSI;
          x_20[0] = (longlong)in_RDI;
          y_19[1] = uVar27;
          local_3c8 = lVar31;
          lStack_3c0 = lVar29;
          alVar33 = add32x4(x_20,y_19);
          y_20[0] = alVar33[1];
          x_21[1] = in_RSI;
          x_21[0] = (longlong)in_RDI;
          y_20[1] = uVar27;
          add32x4(x_21,y_20);
          x_22[1] = in_RSI;
          x_22[0] = (longlong)in_RDI;
          alVar33 = shuf32x4_0_3_2_1(x_22);
          y_21[0] = alVar33[1];
          x_23[1] = in_RSI;
          x_23[0] = (longlong)in_RDI;
          y_21[1] = uVar27;
          alVar33 = add32x4(x_23,y_21);
          y_22[0] = alVar33[1];
          x_24[1] = in_RSI;
          x_24[0] = (longlong)in_RDI;
          y_22[1] = uVar27;
          lVar31 = local_398;
          lVar29 = lStack_390;
          alVar33 = mul32x4(x_24,y_22);
          y_23[0] = alVar33[1];
          x_25[1] = in_RSI;
          x_25[0] = (longlong)in_RDI;
          y_23[1] = uVar27;
          in_stack_fffffffffffffb38 = lVar31;
          in_stack_fffffffffffffb40 = lVar29;
          alVar33 = add32x4(x_25,y_23);
          y_24[0] = alVar33[1];
          x_26[1] = in_RSI;
          x_26[0] = (longlong)in_RDI;
          y_24[1] = uVar27;
          local_3d8 = lVar31;
          lStack_3d0 = lVar29;
          alVar33 = add32x4(x_26,y_24);
          y_25[0] = alVar33[1];
          x_27[1] = in_RSI;
          x_27[0] = (longlong)in_RDI;
          y_25[1] = uVar27;
          add32x4(x_27,y_25);
          a_01[1] = in_stack_fffffffffffffb48;
          a_01[0] = in_stack_fffffffffffffb40;
          b_01[1] = in_stack_fffffffffffffb38;
          b_01[0] = in_stack_fffffffffffffb30;
          c_01[0]._4_4_ = in_stack_fffffffffffffb24;
          c_01[0]._0_4_ = in_stack_fffffffffffffb20;
          c_01[1] = in_stack_fffffffffffffb28;
          d_01[0]._4_4_ = in_stack_fffffffffffffb14;
          d_01[0]._0_4_ = in_stack_fffffffffffffb10;
          d_01[1]._0_4_ = in_stack_fffffffffffffb18;
          d_01[1]._4_4_ = in_stack_fffffffffffffb1c;
          e_01[0]._4_4_ = in_stack_fffffffffffffb04;
          e_01[0]._0_4_ = in_stack_fffffffffffffb00;
          e_01[1]._0_4_ = in_stack_fffffffffffffb08;
          e_01[1]._4_4_ = in_stack_fffffffffffffb0c;
          lVar31 = local_3b8;
          lVar29 = lStack_3b0;
          alVar33 = murk(a_01,b_01,c_01,d_01,e_01);
          y_26[0] = alVar33[1];
          x_28[1] = in_RSI;
          x_28[0] = (longlong)in_RDI;
          y_26[1] = uVar27;
          alVar33 = add32x4(x_28,y_26);
          y_27[0] = alVar33[1];
          local_138 = local_2e8;
          lStack_130 = lStack_2e0;
          local_148 = local_2f8;
          lStack_140 = lStack_2f0;
          auVar12._8_8_ = lStack_2e0;
          auVar12._0_8_ = local_2e8;
          auVar11._8_8_ = lStack_2f0;
          auVar11._0_8_ = local_2f8;
          vpshufb_avx(auVar12,auVar11);
          x_29[1] = in_RSI;
          x_29[0] = (longlong)in_RDI;
          y_27[1] = uVar27;
          local_2d8 = lVar31;
          lStack_2d0 = lVar29;
          alVar33 = xor128(x_29,y_27);
          y_28[0] = alVar33[1];
          x_30[1] = in_RSI;
          x_30[0] = (longlong)in_RDI;
          y_28[1] = uVar27;
          lVar31 = local_3a8;
          lVar29 = lStack_3a0;
          alVar33 = xor128(x_30,y_28);
          y_29[0] = alVar33[1];
          x_31[1] = in_RSI;
          x_31[0] = (longlong)in_RDI;
          y_29[1] = uVar27;
          alVar33 = add32x4(x_31,y_29);
          y_30[0] = alVar33[1];
          x_32[1] = in_RSI;
          x_32[0] = (longlong)in_RDI;
          y_30[1] = uVar27;
          lVar30 = local_3d8;
          lVar32 = lStack_3d0;
          local_2e8 = lVar31;
          lStack_2e0 = lVar29;
          alVar33 = xor128(x_32,y_30);
          y_31[0] = alVar33[1];
          x_33[1] = in_RSI;
          x_33[0] = (longlong)in_RDI;
          y_31[1] = uVar27;
          alVar33 = add32x4(x_33,y_31);
          y_32[0] = alVar33[1];
          x_34[1] = in_RSI;
          x_34[0] = (longlong)in_RDI;
          y_32[1] = uVar27;
          local_2f8 = lVar30;
          lStack_2f0 = lVar32;
          alVar33 = add32x4(x_34,y_32);
          y_33[0] = alVar33[1];
          local_158 = local_2f8;
          lStack_150 = lStack_2f0;
          local_168 = local_2d8;
          lStack_160 = lStack_2d0;
          auVar10._8_8_ = lStack_2f0;
          auVar10._0_8_ = local_2f8;
          auVar9._8_8_ = lStack_2d0;
          auVar9._0_8_ = local_2d8;
          vpshufb_avx(auVar10,auVar9);
          x_35[1] = in_RSI;
          x_35[0] = (longlong)in_RDI;
          y_33[1] = uVar27;
          alVar33 = add32x4(x_35,y_33);
          y_34[0] = alVar33[1];
          x_36[1] = in_RSI;
          x_36[0] = (longlong)in_RDI;
          y_34[1] = uVar27;
          alVar33 = add32x4(x_36,y_34);
          y_35[0] = alVar33[1];
          x_37[1] = in_RSI;
          x_37[0] = (longlong)in_RDI;
          y_35[1] = uVar27;
          alVar33 = add32x4(x_37,y_35);
          y_36[0] = alVar33[1];
          x_38[1] = in_RSI;
          x_38[0] = (longlong)in_RDI;
          y_36[1] = uVar27;
          lVar31 = local_2f8;
          lVar29 = lStack_2f0;
          mul32x4(x_38,y_36);
          local_280 = (longlong *)((long)local_280 + 0x50);
          local_2f8 = lVar31;
          lStack_2f0 = lVar29;
        }
        uVar28 = uVar27;
        local_370 = uVar27;
        if (local_288 != 0) {
          local_204 = (uint)local_288;
          local_4 = (uint)local_288;
          local_8 = (uint)local_288;
          local_c = (uint)local_288;
          local_10 = (uint)local_288;
          y_37[0] = local_288 & 0xffffffff;
          auVar1 = vpinsrd_avx(ZEXT416((uint)local_288),(uint)local_288,1);
          auVar1 = vpinsrd_avx(auVar1,(uint)local_288,2);
          local_28 = vpinsrd_avx(auVar1,(uint)local_288,3);
          x_39[1] = in_RSI;
          x_39[0] = (longlong)in_RDI;
          y_37[1]._0_4_ = (uint)local_288;
          y_37[1]._4_4_ = 0;
          uVar28 = local_288 & 0xffffffff;
          add32x4(x_39,y_37);
          local_280 = (longlong *)((long)local_280 + (local_288 - 0x50));
          lVar31 = local_2d8;
          lVar29 = lStack_2d0;
          fetch128((char *)local_280);
          local_3e8 = lVar31;
          lStack_3e0 = lVar29;
          fetch128((char *)((long)local_280 + 0x10));
          local_3f8 = lVar31;
          lStack_3f0 = lVar29;
          fetch128((char *)((long)local_280 + 0x20));
          local_408 = lVar31;
          lStack_400 = lVar29;
          fetch128((char *)((long)local_280 + 0x30));
          in_RDI = (char *)((long)local_280 + 0x40);
          local_418 = lVar31;
          lStack_410 = lVar29;
          alVar33 = fetch128(in_RDI);
          y_38[0] = alVar33[1];
          x_40[1] = in_RSI;
          x_40[0] = (longlong)in_RDI;
          y_38[1] = uVar28;
          local_428 = lVar31;
          lStack_420 = lVar29;
          alVar33 = add32x4(x_40,y_38);
          y_39[0] = alVar33[1];
          x_41[1] = in_RSI;
          x_41[0] = (longlong)in_RDI;
          y_39[1] = uVar28;
          add32x4(x_41,y_39);
          x_42[1] = in_RSI;
          x_42[0] = (longlong)in_RDI;
          alVar33 = shuf32x4_0_3_2_1(x_42);
          y_40[0] = alVar33[1];
          x_43[1] = in_RSI;
          x_43[0] = (longlong)in_RDI;
          y_40[1] = uVar28;
          alVar33 = add32x4(x_43,y_40);
          y_41[0] = alVar33[1];
          x_44[1] = in_RSI;
          x_44[0] = (longlong)in_RDI;
          y_41[1] = uVar28;
          lVar31 = local_3f8;
          lVar30 = lStack_3f0;
          alVar33 = mul32x4(x_44,y_41);
          y_42[0] = alVar33[1];
          x_45[1] = in_RSI;
          x_45[0] = (longlong)in_RDI;
          y_42[1] = uVar28;
          lVar29 = lVar31;
          lVar32 = lVar30;
          alVar33 = add32x4(x_45,y_42);
          y_43[0] = alVar33[1];
          x_46[1] = in_RSI;
          x_46[0] = (longlong)in_RDI;
          y_43[1] = uVar28;
          local_438 = lVar31;
          lStack_430 = lVar30;
          alVar33 = add32x4(x_46,y_43);
          y_44[0] = alVar33[1];
          x_47[1] = in_RSI;
          x_47[0] = (longlong)in_RDI;
          y_44[1] = uVar28;
          add32x4(x_47,y_44);
          a_02[1] = in_stack_fffffffffffffb48;
          a_02[0] = in_stack_fffffffffffffb40;
          b_02[1] = in_stack_fffffffffffffb38;
          b_02[0] = lVar32;
          c_02[0]._4_4_ = in_stack_fffffffffffffb24;
          c_02[0]._0_4_ = in_stack_fffffffffffffb20;
          c_02[1] = lVar29;
          d_02[0]._4_4_ = in_stack_fffffffffffffb14;
          d_02[0]._0_4_ = in_stack_fffffffffffffb10;
          d_02[1]._0_4_ = in_stack_fffffffffffffb18;
          d_02[1]._4_4_ = in_stack_fffffffffffffb1c;
          alVar33[0]._4_4_ = in_stack_fffffffffffffb04;
          alVar33[0]._0_4_ = in_stack_fffffffffffffb00;
          alVar33[1]._0_4_ = in_stack_fffffffffffffb08;
          alVar33[1]._4_4_ = in_stack_fffffffffffffb0c;
          lVar31 = local_418;
          lVar29 = lStack_410;
          alVar33 = murk(a_02,b_02,c_02,d_02,alVar33);
          y_45[0] = alVar33[1];
          x_48[1] = in_RSI;
          x_48[0] = (longlong)in_RDI;
          y_45[1] = uVar28;
          alVar33 = add32x4(x_48,y_45);
          y_46[0] = alVar33[1];
          local_178 = local_2e8;
          lStack_170 = lStack_2e0;
          local_188 = local_2f8;
          lStack_180 = lStack_2f0;
          auVar8._8_8_ = lStack_2e0;
          auVar8._0_8_ = local_2e8;
          auVar7._8_8_ = lStack_2f0;
          auVar7._0_8_ = local_2f8;
          vpshufb_avx(auVar8,auVar7);
          x_49[1] = in_RSI;
          x_49[0] = (longlong)in_RDI;
          y_46[1] = uVar28;
          local_2d8 = lVar31;
          lStack_2d0 = lVar29;
          alVar33 = xor128(x_49,y_46);
          y_47[0] = alVar33[1];
          x_50[1] = in_RSI;
          x_50[0] = (longlong)in_RDI;
          y_47[1] = uVar28;
          lVar31 = local_408;
          lVar29 = lStack_400;
          alVar33 = xor128(x_50,y_47);
          y_48[0] = alVar33[1];
          x_51[1] = in_RSI;
          x_51[0] = (longlong)in_RDI;
          y_48[1] = uVar28;
          alVar33 = add32x4(x_51,y_48);
          y_49[0] = alVar33[1];
          x_52[1] = in_RSI;
          x_52[0] = (longlong)in_RDI;
          y_49[1] = uVar28;
          lVar30 = local_438;
          lVar32 = lStack_430;
          local_2e8 = lVar31;
          lStack_2e0 = lVar29;
          alVar33 = xor128(x_52,y_49);
          y_50[0] = alVar33[1];
          x_53[1] = in_RSI;
          x_53[0] = (longlong)in_RDI;
          y_50[1] = uVar28;
          alVar33 = add32x4(x_53,y_50);
          y_51[0] = alVar33[1];
          x_54[1] = in_RSI;
          x_54[0] = (longlong)in_RDI;
          y_51[1] = uVar28;
          local_2f8 = lVar30;
          lStack_2f0 = lVar32;
          alVar33 = add32x4(x_54,y_51);
          y_52[0] = alVar33[1];
          local_198 = local_2f8;
          lStack_190 = lStack_2f0;
          local_1a8 = local_2d8;
          lStack_1a0 = lStack_2d0;
          auVar6._8_8_ = lStack_2f0;
          auVar6._0_8_ = local_2f8;
          auVar1._8_8_ = lStack_2d0;
          auVar1._0_8_ = local_2d8;
          vpshufb_avx(auVar6,auVar1);
          x_55[1] = in_RSI;
          x_55[0] = (longlong)in_RDI;
          y_52[1] = uVar28;
          alVar33 = add32x4(x_55,y_52);
          y_53[0] = alVar33[1];
          x_56[1] = in_RSI;
          x_56[0] = (longlong)in_RDI;
          y_53[1] = uVar28;
          alVar33 = add32x4(x_56,y_53);
          y_54[0] = alVar33[1];
          x_57[1] = in_RSI;
          x_57[0] = (longlong)in_RDI;
          y_54[1] = uVar28;
          alVar33 = add32x4(x_57,y_54);
          y_55[0] = alVar33[1];
          x_58[1] = in_RSI;
          x_58[0] = (longlong)in_RDI;
          y_55[1] = uVar28;
          mul32x4(x_58,y_55);
        }
      }
      x_59[1] = in_RSI;
      x_59[0] = (longlong)in_RDI;
      alVar33 = shuf32x4_0_3_2_1(x_59);
      y_56[0] = alVar33[1];
      x_60[1] = in_RSI;
      x_60[0] = (longlong)in_RDI;
      y_56[1] = uVar28;
      alVar33 = xor128(x_60,y_56);
      y_57[0] = alVar33[1];
      x_61[1] = in_RSI;
      x_61[0] = (longlong)in_RDI;
      y_57[1] = uVar28;
      alVar33 = mul32x4(x_61,y_57);
      y_58[0] = alVar33[1];
      x_62[1] = in_RSI;
      x_62[0] = (longlong)in_RDI;
      y_58[1] = uVar28;
      alVar33 = mul32x4(x_62,y_58);
      y_59[0] = alVar33[1];
      x_63[1] = in_RSI;
      x_63[0] = (longlong)in_RDI;
      y_59[1] = uVar28;
      alVar33 = mul32x4(x_63,y_59);
      y_60[0] = alVar33[1];
      x_64[1] = in_RSI;
      x_64[0] = (longlong)in_RDI;
      y_60[1] = uVar28;
      alVar33 = mul32x4(x_64,y_60);
      y_61[0] = alVar33[1];
      local_1b8 = local_2e8;
      lStack_1b0 = lStack_2e0;
      local_1c8 = local_2f8;
      lStack_1c0 = lStack_2f0;
      auVar5._8_8_ = lStack_2e0;
      auVar5._0_8_ = local_2e8;
      auVar4._8_8_ = lStack_2f0;
      auVar4._0_8_ = local_2f8;
      vpshufb_avx(auVar5,auVar4);
      x_65[1] = in_RSI;
      x_65[0] = (longlong)in_RDI;
      y_61[1] = uVar28;
      alVar33 = add32x4(x_65,y_61);
      y_62[0] = alVar33[1];
      x_66[1] = in_RSI;
      x_66[0] = (longlong)in_RDI;
      y_62[1] = uVar28;
      alVar33 = add32x4(x_66,y_62);
      y_63[0] = alVar33[1];
      x_67[1] = in_RSI;
      x_67[0] = (longlong)in_RDI;
      y_63[1] = uVar28;
      alVar33 = add32x4(x_67,y_63);
      y_64[0] = alVar33[1];
      x_68[1] = in_RSI;
      x_68[0] = (longlong)in_RDI;
      y_64[1] = uVar28;
      alVar33 = add32x4(x_68,y_64);
      y_65[0] = alVar33[1];
      x_69[1] = in_RSI;
      x_69[0] = (longlong)in_RDI;
      y_65[1] = uVar28;
      alVar33 = add32x4(x_69,y_65);
      y_66[0] = alVar33[1];
      local_1d8 = local_2f8;
      lStack_1d0 = lStack_2f0;
      local_1e8 = local_2d8;
      lStack_1e0 = lStack_2d0;
      auVar3._8_8_ = lStack_2f0;
      auVar3._0_8_ = local_2f8;
      auVar2._8_8_ = lStack_2d0;
      auVar2._0_8_ = local_2d8;
      vpshufb_avx(auVar3,auVar2);
      x_70[1] = in_RSI;
      x_70[0] = (longlong)in_RDI;
      y_66[1] = uVar28;
      xor128(x_70,y_66);
      local_478 = local_2f8;
      lStack_470 = lStack_2f0;
      local_468 = local_2e8;
      lStack_460 = lStack_2e0;
      local_448 = local_2d8;
      lStack_440 = lStack_2d0;
      local_280 = &local_478;
      local_458 = local_308;
      lStack_450 = lStack_300;
      uVar17 = fetch32((char *)local_280);
      uVar18 = fetch32((char *)((long)local_280 + 4));
      uVar19 = fetch32((char *)(local_280 + 1));
      local_214 = fetch32((char *)((long)local_280 + 0xc));
      uVar20 = crc32(uVar17,local_214);
      local_210 = uVar17;
      local_21c = fetch32((char *)(local_280 + 2));
      iVar21 = crc32(uVar18,local_21c);
      local_218 = uVar18;
      local_224 = fetch32((char *)((long)local_280 + 0x14));
      uVar22 = crc32(uVar19 * -0x3361d2af,local_224);
      local_220 = uVar19 * -0x3361d2af;
      local_22c = fetch32((char *)(local_280 + 3));
      iVar23 = crc32(uVar20,local_22c);
      iVar21 = iVar21 * -0x3361d2af;
      local_228 = uVar20;
      local_234 = fetch32((char *)((long)local_280 + 0x1c));
      iVar24 = crc32(iVar21,local_234);
      local_230 = iVar21;
      local_23c = fetch32((char *)(local_280 + 4));
      iVar25 = crc32(uVar22,local_23c);
      iVar23 = iVar23 * -0x3361d2af;
      local_238 = uVar22;
      local_244 = fetch32((char *)((long)local_280 + 0x24));
      uVar20 = crc32(iVar23,local_244);
      iVar21 = iVar24;
      local_240 = iVar23;
      local_24c = fetch32((char *)(local_280 + 5));
      iVar23 = crc32(iVar21,local_24c);
      iVar25 = iVar25 * -0x3361d2af;
      local_248 = iVar21;
      local_254 = fetch32((char *)((long)local_280 + 0x2c));
      uVar22 = crc32(iVar25,local_254);
      local_250 = iVar25;
      local_25c = fetch32((char *)(local_280 + 6));
      uVar26 = crc32(uVar20,local_25c);
      iVar23 = iVar23 * -0x3361d2af;
      local_258 = uVar20;
      local_264 = fetch32((char *)((long)local_280 + 0x34));
      iVar21 = crc32(iVar23,local_264);
      local_260 = iVar23;
      local_26c = fetch32((char *)(local_280 + 7));
      iVar23 = crc32(uVar22,local_26c);
      local_268 = uVar22;
      uVar17 = fetch32((char *)((long)local_280 + 0x3c));
      iVar25 = crc32(uVar26,uVar17);
      local_278 = (((iVar24 - iVar25) + iVar21) - iVar23) * -0x3361d2af;
    }
  }
  return local_278;
}

Assistant:

uint32_t farmhash32_sa(const char *s, size_t len) {
  const uint32_t seed = 81;
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ?
         farmhash32_mk_len_0_to_4(s, len, 0) :
         farmhash32_mk_len_5_to_12(s, len, 0)) :
        farmhash32_mk_len_13_to_24(s, len, 0);
  }

  if (len < 40) {
    uint32_t a = len, b = seed * c2, c = a + b;
    a += fetch32(s + len - 4);
    b += fetch32(s + len - 20);
    c += fetch32(s + len - 16);
    uint32_t d = a;
    a = ror32(a, 21);
    a = mur(a, mur(b, mur(c, d)));
    a += fetch32(s + len - 12);
    b += fetch32(s + len - 8);
    d += a;
    a += d;
    b = mur(b, d) * c2;
    a = _mm_crc32_u32(a, b + c);
    return farmhash32_mk_len_13_to_24(s, (len + 1) / 2, a) + b;
  }

  const __m128i cc1 = _mm_set1_epi32(c1);
  const __m128i cc2 = _mm_set1_epi32(c2);
  __m128i h = _mm_set1_epi32(seed);
  __m128i g = _mm_set1_epi32(c1 * seed);
  __m128i f = g;
  __m128i k = _mm_set1_epi32(0xe6546b64);
  if (len < 80) {
    __m128i a = fetch128(s);
    __m128i b = fetch128(s + 16);
    __m128i c = fetch128(s + (len - 15) / 2);
    __m128i d = fetch128(s + len - 32);
    __m128i e = fetch128(s + len - 16);
    h = add32x4(h, a);
    g = add32x4(g, b);
    g = shuf32x4_0_3_2_1(g);
    f = add32x4(f, c);
    __m128i be = add32x4(b, mul32x4(e, cc1));
    h = add32x4(h, f);
    f = add32x4(f, h);
    h = add32x4(murk(d, h, cc1, cc2, k), e);
    k = xor128(k, _mm_shuffle_epi8(g, f));
    g = add32x4(xor128(c, g), a);
    f = add32x4(xor128(be, f), d);
    k = add32x4(k, be);
    k = add32x4(k, _mm_shuffle_epi8(f, h));
    f = add32x4(f, g);
    g = add32x4(g, f);
    g = add32x4(_mm_set1_epi32(len), mul32x4(g, cc1));
  } else {
    // len >= 80
    // The following is loosely modelled after farmhash32_mk.
    size_t iters = (len - 1) / 80;
    len -= iters * 80;

#define CHUNK() do {                             \
  __m128i a = fetch128(s);                       \
  __m128i b = fetch128(s + 16);                  \
  __m128i c = fetch128(s + 32);                  \
  __m128i d = fetch128(s + 48);                  \
  __m128i e = fetch128(s + 64);                  \
  h = add32x4(h, a);                             \
  g = add32x4(g, b);                             \
  g = shuf32x4_0_3_2_1(g);                       \
  f = add32x4(f, c);                             \
  __m128i be = add32x4(b, mul32x4(e, cc1));      \
  h = add32x4(h, f);                             \
  f = add32x4(f, h);                             \
  h = add32x4(murk(d, h, cc1, cc2, k), e);       \
  k = xor128(k, _mm_shuffle_epi8(g, f));         \
  g = add32x4(xor128(c, g), a);                  \
  f = add32x4(xor128(be, f), d);                 \
  k = add32x4(k, be);                            \
  k = add32x4(k, _mm_shuffle_epi8(f, h));        \
  f = add32x4(f, g);                             \
  g = add32x4(g, f);                             \
  f = mul32x4(f, cc1);                           \
} while (0)

    while (iters-- != 0) {
      CHUNK();
      s += 80;
    }

    if (len != 0) {
      h = add32x4(h, _mm_set1_epi32(len));
      s = s + len - 80;
      CHUNK();
    }
  }

  g = shuf32x4_0_3_2_1(g);
  k = xor128(k, g);
  f = mul32x4(f, cc1);
  k = mul32x4(k, cc2);
  g = mul32x4(g, cc1);
  h = mul32x4(h, cc2);
  k = add32x4(k, _mm_shuffle_epi8(g, f));
  h = add32x4(h, f);
  f = add32x4(f, h);
  g = add32x4(g, k);
  k = add32x4(k, g);
  k = xor128(k, _mm_shuffle_epi8(f, h));
  __m128i buf[4];
  buf[0] = f;
  buf[1] = g;
  buf[2] = k;
  buf[3] = h;
  s = (char*) buf;
  uint32_t x = fetch32(s);
  uint32_t y = fetch32(s+4);
  uint32_t z = fetch32(s+8);
  x = _mm_crc32_u32(x, fetch32(s+12));
  y = _mm_crc32_u32(y, fetch32(s+16));
  z = _mm_crc32_u32(z * c1, fetch32(s+20));
  x = _mm_crc32_u32(x, fetch32(s+24));
  y = _mm_crc32_u32(y * c1, fetch32(s+28));
  uint32_t o = y;
  z = _mm_crc32_u32(z, fetch32(s+32));
  x = _mm_crc32_u32(x * c1, fetch32(s+36));
  y = _mm_crc32_u32(y, fetch32(s+40));
  z = _mm_crc32_u32(z * c1, fetch32(s+44));
  x = _mm_crc32_u32(x, fetch32(s+48));
  y = _mm_crc32_u32(y * c1, fetch32(s+52));
  z = _mm_crc32_u32(z, fetch32(s+56));
  x = _mm_crc32_u32(x, fetch32(s+60));
  return (o - x + y - z) * c1;
}